

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void cfd::core::MergePsbtOutputItem
               (wally_psbt_output *psbt,wally_psbt_output *psbt_dest,bool ignore_duplicate_error)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t *puVar3;
  allocator local_7a;
  allocator local_79;
  uchar *local_78;
  string local_70;
  string local_50;
  
  sVar1 = psbt_dest->redeem_script_len;
  if (sVar1 != 0) {
    sVar2 = psbt->redeem_script_len;
    if (sVar2 == 0) {
      puVar3 = AllocWallyBuffer(psbt_dest->redeem_script,sVar1);
      psbt->redeem_script = puVar3;
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    }
    else {
      puVar3 = psbt->redeem_script;
      local_78 = psbt_dest->redeem_script;
      ::std::__cxx11::string::string((string *)&local_70,"txout redeem script",&local_79);
      ::std::__cxx11::string::string((string *)&local_50,"",&local_7a);
      ComparePsbtData(puVar3,sVar2,local_78,sVar1,&local_70,&local_50,ignore_duplicate_error);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
  }
  sVar1 = psbt_dest->witness_script_len;
  if (sVar1 != 0) {
    sVar2 = psbt->witness_script_len;
    if (sVar2 == 0) {
      puVar3 = AllocWallyBuffer(psbt_dest->witness_script,sVar1);
      psbt->witness_script = puVar3;
      psbt->witness_script_len = psbt_dest->witness_script_len;
    }
    else {
      puVar3 = psbt->witness_script;
      local_78 = psbt_dest->witness_script;
      ::std::__cxx11::string::string((string *)&local_70,"txout witness script",&local_79);
      ::std::__cxx11::string::string((string *)&local_50,"",&local_7a);
      ComparePsbtData(puVar3,sVar2,local_78,sVar1,&local_70,&local_50,ignore_duplicate_error);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
  }
  ::std::__cxx11::string::string((string *)&local_70,"txout keypaths",(allocator *)&local_50);
  MergeWallyMap(&psbt->keypaths,&psbt_dest->keypaths,&local_70,ignore_duplicate_error);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string((string *)&local_70,"txout unknowns",(allocator *)&local_50);
  MergeWallyMap(&psbt->unknowns,&psbt_dest->unknowns,&local_70,ignore_duplicate_error);
  ::std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void MergePsbtOutputItem(
    struct wally_psbt_output *psbt, const struct wally_psbt_output *psbt_dest,
    bool ignore_duplicate_error) {
  if (psbt_dest->redeem_script_len > 0) {
    if (psbt->redeem_script_len == 0) {
      psbt->redeem_script = AllocWallyBuffer(
          psbt_dest->redeem_script, psbt_dest->redeem_script_len);
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    } else {
      ComparePsbtData(
          psbt->redeem_script, psbt->redeem_script_len,
          psbt_dest->redeem_script, psbt_dest->redeem_script_len,
          "txout redeem script", "", ignore_duplicate_error);
    }
  }
  if (psbt_dest->witness_script_len > 0) {
    if (psbt->witness_script_len == 0) {
      psbt->witness_script = AllocWallyBuffer(
          psbt_dest->witness_script, psbt_dest->witness_script_len);
      psbt->witness_script_len = psbt_dest->witness_script_len;
    } else {
      ComparePsbtData(
          psbt->witness_script, psbt->witness_script_len,
          psbt_dest->witness_script, psbt_dest->witness_script_len,
          "txout witness script", "", ignore_duplicate_error);
    }
  }
  MergeWallyMap(
      &psbt->keypaths, &psbt_dest->keypaths, "txout keypaths",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->unknowns, &psbt_dest->unknowns, "txout unknowns",
      ignore_duplicate_error);
}